

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_mobj.cpp
# Opt level: O1

void P_ZMovement(AActor *mo,double oldfloorz)

{
  double oldz;
  uint uVar1;
  player_t *ppVar2;
  extsector_t *peVar3;
  F3DFloor **ppFVar4;
  undefined8 *puVar5;
  double *pdVar6;
  ASectorAction *pAVar7;
  sector_t *psVar8;
  ulong uVar9;
  int iVar10;
  int iVar11;
  AActor *pAVar12;
  long lVar13;
  bool bVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  FName local_2c;
  DAngle local_28;
  
  uVar1 = (mo->flags).Value;
  dVar20 = 0.0;
  if ((uVar1 >> 9 & 1) == 0) {
    dVar20 = level.gravity * mo->Sector->gravity * mo->Gravity * 0.00125;
  }
  oldz = (mo->__Pos).Z;
  ppVar2 = mo->player;
  if (((ppVar2 != (player_t *)0x0) && (ppVar2->mo == (APlayerPawn *)mo)) && (oldz < mo->floorz)) {
    dVar17 = ppVar2->viewheight - (mo->floorz - oldz);
    ppVar2->viewheight = dVar17;
    ppVar2->deltaviewheight = ((ppVar2->mo->ViewHeight + ppVar2->crouchviewdelta) - dVar17) * 0.125;
  }
  dVar17 = (mo->Vel).Z;
  dVar19 = mo->floorz;
  dVar21 = oldz + dVar17;
  (mo->__Pos).Z = dVar21;
  if (((uVar1 >> 9 & 1) != 0) || (dVar21 <= dVar19)) goto LAB_004230ae;
  iVar11 = mo->waterlevel;
  if (iVar11 == 0) {
LAB_00422f4f:
    (mo->Vel).Z = dVar17 - (double)(~-(ulong)(dVar21 == oldfloorz) & (ulong)dVar20 |
                                   (~-(ulong)(dVar17 == 0.0) & (ulong)dVar20 |
                                   (~-(ulong)(dVar19 < oldfloorz) & (ulong)dVar20 |
                                   (ulong)(dVar20 + dVar20) & -(ulong)(dVar19 < oldfloorz)) &
                                   -(ulong)(dVar17 == 0.0)) & -(ulong)(dVar21 == oldfloorz));
LAB_00422fa2:
    if (ppVar2 == (player_t *)0x0) goto LAB_00422fdb;
    if (iVar11 < 2) goto LAB_004230ae;
    dVar20 = (mo->Vel).Z;
    if (-0.5 <= dVar20) {
      dVar17 = (dVar20 - dVar17) * 0.125 + dVar17;
    }
    else if (-0.5 <= dVar17) {
      dVar17 = -0.5;
    }
  }
  else {
    if (ppVar2 != (player_t *)0x0) {
      if ((ppVar2->cmd).ucmd.sidemove == 0 && (ppVar2->cmd).ucmd.forwardmove == 0)
      goto LAB_00422f4f;
      goto LAB_00422fa2;
    }
LAB_00422fdb:
    if (iVar11 < 1) goto LAB_004230ae;
    if (((uVar1 & 1) == 0) || (((mo->flags3).Value & 0x2000) != 0)) {
      iVar11 = 4000;
      if (mo->Mass < 4000) {
        iVar11 = mo->Mass;
      }
      iVar10 = 1;
      if (1 < iVar11) {
        iVar10 = iVar11;
      }
      dVar20 = ((double)iVar10 * -0.5) / 100.0;
    }
    else {
      dVar20 = 0.0;
      if ((uVar1 >> 0x11 & 1) != 0) {
        dVar20 = -0.0625;
      }
    }
    dVar21 = (mo->Vel).Z;
    if (dVar20 <= dVar21) {
      if (dVar21 <= dVar20) goto LAB_004230ae;
      dVar21 = dVar20 / 3.0;
      if (dVar21 <= -8.0) {
        dVar21 = -8.0;
      }
      dVar21 = dVar17 + dVar21;
      (mo->Vel).Z = dVar21;
      dVar17 = dVar20;
      if (dVar20 <= dVar21) goto LAB_004230ae;
    }
    else {
      dVar18 = dVar20 + dVar20;
      if (dVar18 <= -8.0) {
        dVar18 = -8.0;
      }
      (mo->Vel).Z = dVar21 - dVar18;
      dVar17 = dVar20;
      if (dVar21 - dVar18 <= dVar20) goto LAB_004230ae;
    }
  }
  (mo->Vel).Z = dVar17;
LAB_004230ae:
  if (((0.0 < mo->specialf1) && (((mo->flags2).Value & 0x80000) != 0)) &&
     ((ib_compatflags._1_1_ & 1) != 0)) {
    (mo->__Pos).Z = dVar19 + mo->specialf1;
  }
  if ((((uVar1 >> 0xe & 1) != 0) && (((mo->flags2).Value & 0x10000000) == 0)) &&
     (pAVar12 = (mo->target).field_0.p, pAVar12 != (AActor *)0x0)) {
    if (((pAVar12->super_DThinker).super_DObject.ObjectFlags & 0x20) == 0) {
      if ((uVar1 & 0x1200000) == 0) {
        pAVar12 = (mo->target).field_0.p;
        if ((pAVar12 != (AActor *)0x0) &&
           (((pAVar12->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0)) {
          (mo->target).field_0.p = (AActor *)0x0;
          pAVar12 = (AActor *)0x0;
        }
        dVar17 = AActor::Distance2D(mo,pAVar12,false);
        pAVar12 = (mo->target).field_0.p;
        dVar20 = (mo->__Pos).Z;
        dVar19 = (pAVar12->Height * 0.5 + (pAVar12->__Pos).Z) - dVar20;
        if ((0.0 <= dVar19) || (dVar19 * -3.0 <= dVar17)) {
          if ((0.0 < dVar19) && (dVar17 < dVar19 * 3.0)) {
            (mo->__Pos).Z = dVar20 + mo->FloatSpeed;
          }
        }
        else {
          (mo->__Pos).Z = dVar20 - mo->FloatSpeed;
        }
      }
    }
    else {
      (mo->target).field_0.p = (AActor *)0x0;
    }
  }
  ppVar2 = mo->player;
  if (((ppVar2 != (player_t *)0x0) && (((mo->flags).Value & 0x200) != 0)) &&
     (dVar20 = (mo->__Pos).Z, mo->floorz <= dVar20 && dVar20 != mo->floorz)) {
    if ((ppVar2->mo != (APlayerPawn *)mo) || ((ppVar2->cheats & 0x40000000) == 0)) {
      dVar20 = FFastTrig::sin(&fasttrig,
                              (double)((float)level.maptime * 4.5) * 11930464.711111112 +
                              6755399441055744.0);
      (mo->__Pos).Z = dVar20 * 0.125 + (mo->__Pos).Z;
    }
    (mo->Vel).Z = (mo->Vel).Z * 0.91796875;
  }
  if ((mo->waterlevel != 0) && (((mo->flags).Value & 0x200) == 0)) {
    peVar3 = mo->Sector->e;
    uVar9 = (ulong)(peVar3->XFloor).ffloors.super_TArray<F3DFloor_*,_F3DFloor_*>.Count;
    if (uVar9 == 0) {
      uVar15 = 0;
      uVar16 = 0xbff00000;
    }
    else {
      ppFVar4 = (peVar3->XFloor).ffloors.super_TArray<F3DFloor_*,_F3DFloor_*>.Array;
      uVar15 = 0;
      uVar16 = 0xbff00000;
      lVar13 = 0;
      do {
        puVar5 = *(undefined8 **)((long)ppFVar4 + lVar13);
        if ((~*(uint *)(puVar5 + 0xb) & 0x11) == 0) {
          dVar20 = (mo->__Pos).Z;
          pdVar6 = (double *)puVar5[5];
          dVar17 = (mo->__Pos).X;
          dVar19 = (mo->__Pos).Y;
          if (((pdVar6[1] * dVar19 + *pdVar6 * dVar17 + pdVar6[3]) * pdVar6[4] <= dVar20) ||
             (pdVar6 = (double *)*puVar5,
             dVar20 + mo->Height * 0.5 <
             (dVar19 * pdVar6[1] + dVar17 * *pdVar6 + pdVar6[3]) * pdVar6[4])) goto LAB_00423322;
          dVar20 = sector_t::GetFriction
                             ((sector_t_conflict *)puVar5[0xd],*(int *)(puVar5 + 8),(double *)0x0);
          uVar15 = SUB84(dVar20,0);
          uVar16 = (undefined4)((ulong)dVar20 >> 0x20);
          bVar14 = true;
        }
        else {
LAB_00423322:
          bVar14 = false;
        }
      } while ((!bVar14) && (bVar14 = uVar9 * 8 + -8 != lVar13, lVar13 = lVar13 + 8, bVar14));
    }
    if ((double)CONCAT44(uVar16,uVar15) <= 0.0 && (double)CONCAT44(uVar16,uVar15) != 0.0) {
      dVar20 = sector_t::GetFriction((sector_t_conflict *)mo->Sector,0,(double *)0x0);
      uVar15 = SUB84(dVar20,0);
      uVar16 = (undefined4)((ulong)dVar20 >> 0x20);
    }
    (mo->Vel).Z = (double)CONCAT44(uVar16,uVar15) * (mo->Vel).Z;
  }
  dVar20 = mo->floorz;
  if ((mo->__Pos).Z <= dVar20) {
    if ((mo->player == (player_t *)0x0) || ((mo->player->cheats & 0x2000) == 0)) {
      pAVar7 = (mo->Sector->SecActTarget).field_0.p;
      if (pAVar7 != (ASectorAction *)0x0) {
        if (((pAVar7->super_AActor).super_DThinker.super_DObject.ObjectFlags & 0x20) == 0) {
          psVar8 = mo->Sector;
          dVar17 = ((psVar8->floorplane).normal.Y * (mo->__Pos).Y +
                   (psVar8->floorplane).normal.X * (mo->__Pos).X + (psVar8->floorplane).D) *
                   (psVar8->floorplane).negiC;
          if ((dVar17 == dVar20) && (!NAN(dVar17) && !NAN(dVar20))) {
            ASectorAction::TriggerAction((psVar8->SecActTarget).field_0.p,mo,4);
          }
        }
        else {
          (mo->Sector->SecActTarget).field_0.p = (ASectorAction *)0x0;
        }
      }
    }
    P_CheckFor3DFloorHit(mo,mo->floorz);
    if ((mo->__Pos).Z <= mo->floorz) {
      if (((mo->flags).Value & 0x11000) == 0x10000) {
        (mo->__Pos).Z = mo->floorz;
        if (((mo->BounceFlags).Value & 2) != 0) {
          AActor::FloorBounceMissile(mo,&mo->floorsector->floorplane);
          return;
        }
        uVar1 = (mo->flags3).Value;
        if ((uVar1 >> 0x1c & 1) != 0) {
          P_HitFloor(mo);
          (mo->Vel).Z = 0.0;
          return;
        }
        if ((uVar1 & 1) != 0) {
          return;
        }
        if (((uVar1 >> 0xe & 1) == 0) && ((mo->floorpic).texnum == skyflatnum.texnum)) {
          (*(mo->super_DThinker).super_DObject._vptr_DObject[4])(mo);
          return;
        }
        P_HitFloor(mo);
        P_ExplodeMissile(mo,(line_t_conflict *)0x0,(AActor *)0x0);
        return;
      }
      if ((((mo->BounceFlags).Value & 0x1000) != 0) &&
         ((dVar20 = (mo->Vel).Z, dVar20 != 0.0 || (NAN(dVar20))))) {
        AActor::FloorBounceMissile(mo,&mo->floorsector->floorplane);
      }
      if ((((mo->flags3).Value & 0x2000) != 0) &&
         (pdVar6 = &(mo->Vel).Z, *pdVar6 <= -23.0 && *pdVar6 != -23.0)) {
        P_MonsterFallingDamage(mo);
      }
      (mo->__Pos).Z = mo->floorz;
      pdVar6 = &(mo->Vel).Z;
      if (*pdVar6 <= 0.0 && *pdVar6 != 0.0) {
        P_HitFloor(mo);
        if (((mo->DamageType).super_FName.Index == 0x33) &&
           (pdVar6 = &(mo->Vel).Z, *pdVar6 <= -8.0 && *pdVar6 != -8.0)) {
          mo->tics = 1;
          (mo->Vel).X = 0.0;
          (mo->Vel).Y = 0.0;
          (mo->Vel).Z = 0.0;
          return;
        }
        if (((mo->flags7).Value & 0x4000000) != 0) {
          local_2c.Index = 0x9f;
          local_28.Degrees = 0.0;
          P_DamageMobj(mo,(AActor *)0x0,(AActor *)0x0,mo->health,&local_2c,0,&local_28);
        }
        ppVar2 = mo->player;
        if (ppVar2 != (player_t *)0x0) {
          if ((ppVar2->jumpTics < 0) || (pdVar6 = &(mo->Vel).Z, *pdVar6 <= -8.0 && *pdVar6 != -8.0))
          {
            ppVar2->jumpTics = 7;
          }
          pdVar6 = &(mo->Vel).Z;
          if ((*pdVar6 <= -8.0 && *pdVar6 != -8.0) && (((mo->flags).Value & 0x200) == 0)) {
            PlayerLandedOnThing(mo,(AActor *)0x0);
          }
        }
        (mo->Vel).Z = 0.0;
      }
      if (((mo->flags).Value & 0x1000000) != 0) {
        (mo->Vel).Z = -(mo->Vel).Z;
      }
      AActor::Crash(mo);
    }
  }
  if (((mo->flags2).Value & 0x20) != 0) {
    AActor::AdjustFloorClip(mo);
  }
  dVar20 = mo->ceilingz;
  if (dVar20 < (mo->__Pos).Z + mo->Height) {
    if ((mo->player == (player_t *)0x0) || ((mo->player->cheats & 0x2000) == 0)) {
      pAVar7 = (mo->Sector->SecActTarget).field_0.p;
      if (pAVar7 != (ASectorAction *)0x0) {
        if (((pAVar7->super_AActor).super_DThinker.super_DObject.ObjectFlags & 0x20) == 0) {
          psVar8 = mo->Sector;
          dVar17 = ((psVar8->ceilingplane).normal.Y * (mo->__Pos).Y +
                   (psVar8->ceilingplane).normal.X * (mo->__Pos).X + (psVar8->ceilingplane).D) *
                   (psVar8->ceilingplane).negiC;
          if ((dVar17 == dVar20) && (!NAN(dVar17) && !NAN(dVar20))) {
            ASectorAction::TriggerAction((psVar8->SecActTarget).field_0.p,mo,8);
          }
        }
        else {
          (mo->Sector->SecActTarget).field_0.p = (ASectorAction *)0x0;
        }
      }
    }
    P_CheckFor3DCeilingHit(mo,mo->ceilingz);
    if (mo->ceilingz < (mo->__Pos).Z + mo->Height) {
      (mo->__Pos).Z = mo->ceilingz - mo->Height;
      if (((mo->BounceFlags).Value & 4) != 0) {
        AActor::FloorBounceMissile(mo,&mo->ceilingsector->ceilingplane);
        return;
      }
      uVar1 = (mo->flags).Value;
      if ((uVar1 >> 0x18 & 1) != 0) {
        (mo->Vel).Z = -(mo->Vel).Z;
      }
      if (0.0 < (mo->Vel).Z) {
        (mo->Vel).Z = 0.0;
      }
      if ((uVar1 & 0x11000) == 0x10000) {
        uVar1 = (mo->flags3).Value;
        if ((uVar1 & 2) != 0) {
          return;
        }
        if (((uVar1 >> 0xe & 1) == 0) && ((mo->ceilingpic).texnum == skyflatnum.texnum)) {
          (*(mo->super_DThinker).super_DObject._vptr_DObject[4])(mo);
          return;
        }
        P_ExplodeMissile(mo,(line_t_conflict *)0x0,(AActor *)0x0);
        return;
      }
    }
  }
  P_CheckFakeFloorTriggers(mo,oldz,false);
  return;
}

Assistant:

void P_ZMovement (AActor *mo, double oldfloorz)
{
	double dist;
	double delta;
	double oldz = mo->Z();
	double grav = mo->GetGravity();

//
// check for smooth step up
//
	if (mo->player && mo->player->mo == mo && mo->Z() < mo->floorz)
	{
		mo->player->viewheight -= mo->floorz - mo->Z();
		mo->player->deltaviewheight = mo->player->GetDeltaViewHeight();
	}

	mo->AddZ(mo->Vel.Z);

//
// apply gravity
//
	if (mo->Z() > mo->floorz && !(mo->flags & MF_NOGRAVITY))
	{
		double startvelz = mo->Vel.Z;

		if (mo->waterlevel == 0 || (mo->player &&
			!(mo->player->cmd.ucmd.forwardmove | mo->player->cmd.ucmd.sidemove)))
		{
			// [RH] Double gravity only if running off a ledge. Coming down from
			// an upward thrust (e.g. a jump) should not double it.
			if (mo->Vel.Z == 0 && oldfloorz > mo->floorz && mo->Z() == oldfloorz)
			{
				mo->Vel.Z -= grav + grav;
			}
			else
			{
				mo->Vel.Z -= grav;
			}
		}
		if (mo->player == NULL)
		{
			if (mo->waterlevel >= 1)
			{
				double sinkspeed;

				if ((mo->flags & MF_SPECIAL) && !(mo->flags3 & MF3_ISMONSTER))
				{ // Pickup items don't sink if placed and drop slowly if dropped
					sinkspeed = (mo->flags & MF_DROPPED) ? -WATER_SINK_SPEED / 8 : 0;
				}
				else
				{
					sinkspeed = -WATER_SINK_SPEED;

					// If it's not a player, scale sinkspeed by its mass, with
					// 100 being equivalent to a player.
					if (mo->player == NULL)
					{
						sinkspeed = sinkspeed * clamp(mo->Mass, 1, 4000) / 100;
					}
				}
				if (mo->Vel.Z < sinkspeed)
				{ // Dropping too fast, so slow down toward sinkspeed.
					mo->Vel.Z -= MAX(sinkspeed*2, -8.);
					if (mo->Vel.Z > sinkspeed)
					{
						mo->Vel.Z = sinkspeed;
					}
				}
				else if (mo->Vel.Z > sinkspeed)
				{ // Dropping too slow/going up, so trend toward sinkspeed.
					mo->Vel.Z = startvelz + MAX(sinkspeed/3, -8.);
					if (mo->Vel.Z < sinkspeed)
					{
						mo->Vel.Z = sinkspeed;
					}
				}
			}
		}
		else
		{
			if (mo->waterlevel > 1)
			{
				double sinkspeed = -WATER_SINK_SPEED;

				if (mo->Vel.Z < sinkspeed)
				{
					mo->Vel.Z = (startvelz < sinkspeed) ? startvelz : sinkspeed;
				}
				else
				{
					mo->Vel.Z = startvelz + ((mo->Vel.Z - startvelz) *
						(mo->waterlevel == 1 ? WATER_SINK_SMALL_FACTOR : WATER_SINK_FACTOR));
				}
			}
		}
	}

	// Hexen compatibility handling for floatbobbing. Ugh...
	// Hexen yanked all items to the floor, except those being spawned at map start in the air.
	// Those were kept at their original height.
	// Do this only if the item was actually spawned by the map above ground to avoid problems.
	if (mo->specialf1 > 0 && (mo->flags2 & MF2_FLOATBOB) && (ib_compatflags & BCOMPATF_FLOATBOB))
	{
		mo->SetZ(mo->floorz + mo->specialf1);
	}


//
// adjust height
//
	if ((mo->flags & MF_FLOAT) && !(mo->flags2 & MF2_DORMANT) && mo->target)
	{	// float down towards target if too close
		if (!(mo->flags & (MF_SKULLFLY | MF_INFLOAT)))
		{
			dist = mo->Distance2D (mo->target);
			delta = (mo->target->Center()) - mo->Z();
			if (delta < 0 && dist < -(delta*3))
				mo->AddZ(-mo->FloatSpeed);
			else if (delta > 0 && dist < (delta*3))
				mo->AddZ(mo->FloatSpeed);
		}
	}
	if (mo->player && (mo->flags & MF_NOGRAVITY) && (mo->Z() > mo->floorz))
	{
		if (!mo->IsNoClip2())
		{
			mo->AddZ(DAngle(360 / 80.f * level.maptime).Sin() / 8);
		}
		mo->Vel.Z *= FRICTION_FLY;
	}
	if (mo->waterlevel && !(mo->flags & MF_NOGRAVITY))
	{
		double friction = -1;

		// Check 3D floors -- might be the source of the waterlevel
		for (auto rover : mo->Sector->e->XFloor.ffloors)
		{
			if (!(rover->flags & FF_EXISTS)) continue;
			if (!(rover->flags & FF_SWIMMABLE)) continue;

			if (mo->Z() >= rover->top.plane->ZatPoint(mo) ||
				mo->Center() < rover->bottom.plane->ZatPoint(mo))
				continue;

			friction = rover->model->GetFriction(rover->top.isceiling);
			break;
		}
		if (friction < 0)
			friction = mo->Sector->GetFriction();	// get real friction, even if from a terrain definition

		mo->Vel.Z *= friction;
	}

//
// clip movement
//
	if (mo->Z() <= mo->floorz)
	{	// Hit the floor
		if ((!mo->player || !(mo->player->cheats & CF_PREDICTING)) &&
			mo->Sector->SecActTarget != NULL &&
			mo->Sector->floorplane.ZatPoint(mo) == mo->floorz)
		{ // [RH] Let the sector do something to the actor
			mo->Sector->SecActTarget->TriggerAction (mo, SECSPAC_HitFloor);
		}
		P_CheckFor3DFloorHit(mo, mo->floorz);
		// [RH] Need to recheck this because the sector action might have
		// teleported the actor so it is no longer below the floor.
		if (mo->Z() <= mo->floorz)
		{
			if ((mo->flags & MF_MISSILE) && !(mo->flags & MF_NOCLIP))
			{
				mo->SetZ(mo->floorz);
				if (mo->BounceFlags & BOUNCE_Floors)
				{
					mo->FloorBounceMissile (mo->floorsector->floorplane);
					/* if (!(mo->flags6 & MF6_CANJUMP)) */ return;
				}
				else if (mo->flags3 & MF3_NOEXPLODEFLOOR)
				{
					P_HitFloor (mo);
					mo->Vel.Z = 0;
					return;
				}
				else if (mo->flags3 & MF3_FLOORHUGGER)
				{ // Floor huggers can go up steps
					return;
				}
				else
				{
					if (mo->floorpic == skyflatnum && !(mo->flags3 & MF3_SKYEXPLODE))
					{
						// [RH] Just remove the missile without exploding it
						//		if this is a sky floor.
						mo->Destroy ();
						return;
					}
					P_HitFloor (mo);
					P_ExplodeMissile (mo, NULL, NULL);
					return;
				}
			}
			else if (mo->BounceFlags & BOUNCE_MBF && mo->Vel.Z) // check for MBF-like bounce on non-missiles
			{
				mo->FloorBounceMissile(mo->floorsector->floorplane);
			}
			if (mo->flags3 & MF3_ISMONSTER)		// Blasted mobj falling
			{
				if (mo->Vel.Z < -23)
				{
					P_MonsterFallingDamage (mo);
				}
			}
			mo->SetZ(mo->floorz);
			if (mo->Vel.Z < 0)
			{
				const double minvel = -8;	// landing speed from a jump with normal gravity

				// Spawn splashes, etc.
				P_HitFloor (mo);
				if (mo->DamageType == NAME_Ice && mo->Vel.Z < minvel)
				{
					mo->tics = 1;
					mo->Vel.Zero();
					return;
				}
				// Let the actor do something special for hitting the floor
				if (mo->flags7 & MF7_SMASHABLE)
				{
					P_DamageMobj(mo, nullptr, nullptr, mo->health, NAME_Smash);
				}
				if (mo->player)
				{
					if (mo->player->jumpTics < 0 || mo->Vel.Z < minvel)
					{ // delay any jumping for a short while
						mo->player->jumpTics = 7;
					}
					if (mo->Vel.Z < minvel && !(mo->flags & MF_NOGRAVITY))
					{
						// Squat down.
						// Decrease viewheight for a moment after hitting the ground (hard),
						// and utter appropriate sound.
						PlayerLandedOnThing (mo, NULL);
					}
				}
				mo->Vel.Z = 0;
			}
			if (mo->flags & MF_SKULLFLY)
			{ // The skull slammed into something
				mo->Vel.Z = -mo->Vel.Z;
			}
			mo->Crash();
		}
	}

	if (mo->flags2 & MF2_FLOORCLIP)
	{
		mo->AdjustFloorClip ();
	}

	if (mo->Top() > mo->ceilingz)
	{ // hit the ceiling
		if ((!mo->player || !(mo->player->cheats & CF_PREDICTING)) &&
			mo->Sector->SecActTarget != NULL &&
			mo->Sector->ceilingplane.ZatPoint(mo) == mo->ceilingz)
		{ // [RH] Let the sector do something to the actor
			mo->Sector->SecActTarget->TriggerAction (mo, SECSPAC_HitCeiling);
		}
		P_CheckFor3DCeilingHit(mo, mo->ceilingz);
		// [RH] Need to recheck this because the sector action might have
		// teleported the actor so it is no longer above the ceiling.
		if (mo->Top() > mo->ceilingz)
		{
			mo->SetZ(mo->ceilingz - mo->Height);
			if (mo->BounceFlags & BOUNCE_Ceilings)
			{	// ceiling bounce
				mo->FloorBounceMissile (mo->ceilingsector->ceilingplane);
				/*if (!(mo->flags6 & MF6_CANJUMP))*/ return;
			}
			if (mo->flags & MF_SKULLFLY)
			{	// the skull slammed into something
				mo->Vel.Z = -mo->Vel.Z;
			}
			if (mo->Vel.Z > 0)
				mo->Vel.Z = 0;
			if ((mo->flags & MF_MISSILE) && !(mo->flags & MF_NOCLIP))
			{
				if (mo->flags3 & MF3_CEILINGHUGGER)
				{
					return;
				}
				if (mo->ceilingpic == skyflatnum &&  !(mo->flags3 & MF3_SKYEXPLODE))
				{
					mo->Destroy ();
					return;
				}
				P_ExplodeMissile (mo, NULL, NULL);
				return;
			}
		}
	}
	P_CheckFakeFloorTriggers (mo, oldz);
}